

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O3

int sp_ctrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,singlecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  singlecomplex *psVar1;
  singlecomplex *psVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  float fVar24;
  singlecomplex sVar25;
  singlecomplex sVar26;
  singlecomplex sVar27;
  singlecomplex sVar28;
  singlecomplex sVar29;
  singlecomplex sVar30;
  singlecomplex sVar31;
  singlecomplex sVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  int nsupc;
  int nsupr;
  void *local_178;
  void *local_170;
  int incx;
  singlecomplex *local_160;
  undefined8 local_158;
  float fStack_150;
  float fStack_14c;
  singlecomplex *local_148;
  long local_140;
  singlecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo != 'U') && (*uplo != 'L')) {
    fVar38 = 1.4013e-45;
    iVar23 = -1;
LAB_0011188e:
    *info = iVar23;
    temp.r = fVar38;
    input_error("sp_ctrsv",(int *)&temp);
    return 0;
  }
  fVar38 = 2.8026e-45;
  iVar23 = -2;
  if ((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0))
  goto LAB_0011188e;
  if ((*diag != 'U') && (*diag != 'N')) {
    fVar38 = 4.2039e-45;
    iVar23 = -3;
    goto LAB_0011188e;
  }
  iVar4 = L->nrow;
  fVar38 = 5.60519e-45;
  iVar23 = -4;
  if (((long)iVar4 < 0) || (iVar4 != L->ncol)) goto LAB_0011188e;
  fVar38 = 7.00649e-45;
  iVar23 = -5;
  if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_0011188e;
  local_170 = L->Store;
  lVar7 = *(long *)((long)local_170 + 8);
  local_178 = U->Store;
  lVar19 = *(long *)((long)local_178 + 8);
  local_160 = (singlecomplex *)trans;
  local_148 = singlecomplexCalloc((long)iVar4);
  if (local_148 == (singlecomplex *)0x0) {
    sprintf((char *)&temp,"%s at line %d in file %s\n","Malloc fails for work in sp_ctrsv().",0x81);
    superlu_abort_and_exit((char *)&temp);
  }
  cVar3 = *uplo;
  if (*(char *)&local_160->r == 'T') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_170 + 4)) {
        fVar38 = 0.0;
        lVar19 = (long)*(int *)((long)local_170 + 4);
        do {
          lVar9 = *(long *)((long)local_170 + 0x30);
          iVar23 = *(int *)(lVar9 + lVar19 * 4);
          lVar15 = (long)iVar23;
          iVar4 = *(int *)(*(long *)((long)local_170 + 0x20) + lVar15 * 4);
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar15 * 4) - iVar4;
          nsupc = *(int *)(lVar9 + 4 + lVar19 * 4) - iVar23;
          lVar10 = *(long *)((long)local_170 + 0x10);
          iVar13 = *(int *)(lVar10 + lVar15 * 4);
          local_178 = (void *)CONCAT44(local_178._4_4_,iVar13);
          iVar6 = *(int *)(lVar9 + 4 + lVar19 * 4);
          if (iVar23 < iVar6) {
            lVar9 = lVar15;
            iVar23 = iVar13;
            do {
              iVar12 = iVar23 + nsupc;
              iVar23 = *(int *)(lVar10 + 4 + lVar9 * 4);
              if (iVar12 < iVar23) {
                sVar27 = x[lVar9];
                lVar14 = (long)iVar12;
                piVar20 = (int *)(*(long *)((long)local_170 + 0x18) + (long)(iVar4 + nsupc) * 4);
                do {
                  fVar34 = *(float *)(lVar7 + lVar14 * 8);
                  fVar37 = x[*piVar20].r;
                  fVar33 = x[*piVar20].i;
                  fVar35 = *(float *)(lVar7 + 4 + lVar14 * 8);
                  fVar36 = sVar27.i;
                  sVar27.r = sVar27.r - (fVar34 * fVar37 + -fVar33 * fVar35);
                  sVar27.i = fVar36 - (fVar34 * fVar33 + fVar37 * fVar35);
                  x[lVar9] = sVar27;
                  lVar14 = lVar14 + 1;
                  piVar20 = piVar20 + 1;
                } while (lVar14 < iVar23);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != iVar6);
          }
          fVar38 = fVar38 + (float)((nsupr - nsupc) * nsupc * 8);
          if (1 < nsupc) {
            fVar38 = fVar38 + (float)((nsupc + -1) * nsupc * 4);
            ctrsv_("L","T","U",&nsupc,(singlecomplex *)(lVar7 + (long)iVar13 * 8),&nsupr,x + lVar15,
                   &incx);
          }
          bVar8 = 0 < lVar19;
          lVar19 = lVar19 + -1;
        } while (bVar8);
        goto LAB_001120da;
      }
    }
    else {
      if (U->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        fVar38 = 0.0;
        lVar9 = 0;
        do {
          lVar10 = *(long *)((long)local_170 + 0x30);
          iVar23 = *(int *)(lVar10 + lVar9 * 4);
          lVar15 = (long)iVar23;
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar15 * 4) -
                  *(int *)(*(long *)((long)local_170 + 0x20) + lVar15 * 4);
          iVar13 = *(int *)(lVar10 + 4 + lVar9 * 4) - iVar23;
          local_158 = (long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar15 * 4);
          iVar4 = *(int *)(lVar10 + 4 + lVar9 * 4);
          if (iVar23 < iVar4) {
            lVar10 = *(long *)((long)local_178 + 0x18);
            lVar14 = lVar15;
            iVar23 = *(int *)(lVar10 + lVar15 * 4);
            do {
              iVar6 = *(int *)(lVar10 + 4 + lVar14 * 4);
              if (iVar6 - iVar23 != 0 && iVar23 <= iVar6) {
                lVar17 = *(long *)((long)local_178 + 0x10);
                sVar31 = x[lVar14];
                lVar22 = (long)iVar23;
                do {
                  fVar34 = *(float *)(lVar19 + lVar22 * 8);
                  fVar37 = x[*(int *)(lVar17 + lVar22 * 4)].r;
                  fVar33 = x[*(int *)(lVar17 + lVar22 * 4)].i;
                  fVar35 = *(float *)(lVar19 + 4 + lVar22 * 8);
                  fVar36 = sVar31.i;
                  sVar31.r = sVar31.r - (fVar34 * fVar37 + -fVar33 * fVar35);
                  sVar31.i = fVar36 - (fVar34 * fVar33 + fVar37 * fVar35);
                  x[lVar14] = sVar31;
                  lVar22 = lVar22 + 1;
                } while (iVar6 != lVar22);
              }
              lVar14 = lVar14 + 1;
              fVar38 = fVar38 + (float)((iVar6 - iVar23) * 8);
              iVar23 = iVar6;
            } while (lVar14 != iVar4);
          }
          psVar2 = x + lVar15;
          psVar1 = (singlecomplex *)(lVar7 + local_158 * 8);
          nsupc = iVar13;
          if (iVar13 == 1) {
            c_div(psVar2,psVar2,psVar1);
          }
          else {
            ctrsv_("U","T","N",&nsupc,psVar1,&nsupr,psVar2,&incx);
          }
          fVar38 = fVar38 + (float)((iVar13 * 4 + 0xe) * iVar13);
          bVar8 = lVar9 < *(int *)((long)local_170 + 4);
          lVar9 = lVar9 + 1;
        } while (bVar8);
        goto LAB_001120da;
      }
    }
  }
  else if (*(char *)&local_160->r == 'N') {
    if (cVar3 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        local_140 = lVar7 + 0xc;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        pvVar16 = (void *)0x0;
        pvVar18 = local_170;
        do {
          lVar19 = *(long *)((long)pvVar18 + 0x20);
          iVar23 = *(int *)(*(long *)((long)pvVar18 + 0x30) + (long)pvVar16 * 4);
          lVar9 = (long)iVar23;
          uVar5 = *(uint *)(lVar19 + lVar9 * 4);
          nsupr = *(int *)(lVar19 + 4 + lVar9 * 4) - uVar5;
          iVar23 = *(int *)(*(long *)((long)pvVar18 + 0x30) + 4 + (long)pvVar16 * 4) - iVar23;
          iVar4 = *(int *)(*(long *)((long)pvVar18 + 0x10) + lVar9 * 4);
          uVar21 = nsupr - iVar23;
          nsupc = iVar23;
          if (iVar23 == 1) {
            iVar13 = *(int *)(lVar19 + 4 + lVar9 * 4);
            if ((int)((long)(int)uVar5 + 1) < iVar13) {
              lVar10 = *(long *)((long)pvVar18 + 0x18);
              lVar19 = local_140 + (long)iVar4 * 8;
              lVar15 = 0;
              do {
                iVar4 = *(int *)(((long)(int)uVar5 + 1) * 4 + lVar10 + lVar15 * 4);
                fVar37 = *(float *)(lVar19 + -4 + lVar15 * 8);
                fVar24 = x[lVar9].r;
                fVar35 = x[lVar9].i;
                fVar33 = *(float *)(lVar19 + lVar15 * 8);
                fVar34 = fVar37 * fVar24 + -fVar35 * fVar33;
                fVar35 = fVar37 * fVar35 + fVar24 * fVar33;
                fVar36 = fVar37 * 0.0 + fVar24 * fVar33;
                fVar37 = fVar37 * 0.0 + fVar24 * fVar33;
                sVar25.r = x[iVar4].r - fVar34;
                sVar25.i = x[iVar4].i - fVar35;
                x[iVar4] = sVar25;
                lVar15 = lVar15 + 1;
              } while (~uVar5 + iVar13 != (int)lVar15);
            }
          }
          else {
            local_158 = CONCAT44(fVar35,fVar34);
            local_160 = x + lVar9;
            local_178 = pvVar16;
            fStack_150 = fVar36;
            fStack_14c = fVar37;
            clsolve(nsupr,iVar23,(singlecomplex *)(lVar7 + (long)iVar4 * 8),local_160);
            psVar2 = local_148;
            cmatvec(nsupr,nsupr - nsupc,nsupc,(singlecomplex *)(lVar7 + (long)(nsupc + iVar4) * 8),
                    local_160,local_148);
            pvVar16 = local_178;
            pvVar18 = local_170;
            fVar34 = (float)local_158;
            fVar35 = local_158._4_4_;
            fVar36 = fStack_150;
            fVar37 = fStack_14c;
            if (0 < (int)uVar21) {
              lVar19 = *(long *)((long)local_170 + 0x18);
              uVar11 = 0;
              do {
                iVar4 = *(int *)((long)(int)(uVar5 + nsupc) * 4 + lVar19 + uVar11 * 4);
                sVar31 = psVar2[uVar11];
                sVar26.r = x[iVar4].r - sVar31.r;
                sVar26.i = x[iVar4].i - sVar31.i;
                x[iVar4] = sVar26;
                psVar1 = psVar2 + uVar11;
                psVar1->r = (float)local_158;
                psVar1->i = local_158._4_4_;
                uVar11 = uVar11 + 1;
              } while (uVar11 < uVar21);
            }
          }
          fVar38 = fVar38 + (float)((iVar23 * 4 + 6) * iVar23) + (float)(int)(uVar21 * iVar23 * 8);
          bVar8 = (long)pvVar16 < (long)*(int *)((long)pvVar18 + 4);
          pvVar16 = (void *)((long)pvVar16 + 1);
        } while (bVar8);
        goto LAB_001120da;
      }
    }
    else {
      if (U->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_170 + 4)) {
        fVar38 = 0.0;
        pvVar16 = local_170;
        lVar9 = (long)*(int *)((long)local_170 + 4);
        do {
          iVar23 = *(int *)(*(long *)((long)pvVar16 + 0x30) + lVar9 * 4);
          lVar15 = (long)iVar23;
          nsupr = *(int *)(*(long *)((long)pvVar16 + 0x20) + 4 + lVar15 * 4) -
                  *(int *)(*(long *)((long)pvVar16 + 0x20) + lVar15 * 4);
          nsupc = *(int *)(*(long *)((long)pvVar16 + 0x30) + 4 + lVar9 * 4) - iVar23;
          lVar10 = (long)*(int *)(*(long *)((long)pvVar16 + 0x10) + lVar15 * 4);
          fVar38 = (float)((nsupc * 4 + 0xe) * nsupc) + fVar38;
          if (nsupc == 1) {
            psVar2 = x + lVar15;
            c_div(psVar2,psVar2,(singlecomplex *)(lVar7 + lVar10 * 8));
            iVar23 = *(int *)(*(long *)((long)local_178 + 0x18) + lVar15 * 4);
            lVar10 = (long)iVar23;
            iVar4 = *(int *)(*(long *)((long)local_178 + 0x18) + 4 + lVar15 * 4);
            pvVar16 = local_170;
            if (iVar23 < iVar4) {
              lVar15 = *(long *)((long)local_178 + 0x10);
              do {
                iVar23 = *(int *)(lVar15 + lVar10 * 4);
                fVar36 = (*psVar2).r;
                fVar37 = (*psVar2).i;
                fVar34 = *(float *)(lVar19 + lVar10 * 8);
                fVar35 = *(float *)(lVar19 + 4 + lVar10 * 8);
                sVar29.r = x[iVar23].r - (fVar34 * fVar36 + -fVar37 * fVar35);
                sVar29.i = x[iVar23].i - (fVar34 * fVar37 + fVar36 * fVar35);
                x[iVar23] = sVar29;
                lVar10 = lVar10 + 1;
              } while (iVar4 != lVar10);
            }
          }
          else {
            cusolve(nsupr,nsupc,(singlecomplex *)(lVar7 + lVar10 * 8),x + lVar15);
            iVar4 = *(int *)(*(long *)((long)pvVar16 + 0x30) + 4 + lVar9 * 4);
            if (iVar23 < iVar4) {
              lVar10 = *(long *)((long)local_178 + 0x18);
              iVar23 = *(int *)(lVar10 + lVar15 * 4);
              do {
                iVar13 = *(int *)(lVar10 + 4 + lVar15 * 4);
                if (iVar13 - iVar23 != 0 && iVar23 <= iVar13) {
                  lVar14 = *(long *)((long)local_178 + 0x10);
                  lVar17 = (long)iVar23;
                  do {
                    iVar6 = *(int *)(lVar14 + lVar17 * 4);
                    fVar36 = x[lVar15].r;
                    fVar37 = x[lVar15].i;
                    fVar34 = *(float *)(lVar19 + lVar17 * 8);
                    fVar35 = *(float *)(lVar19 + 4 + lVar17 * 8);
                    sVar30.r = x[iVar6].r - (fVar34 * fVar36 + -fVar37 * fVar35);
                    sVar30.i = x[iVar6].i - (fVar34 * fVar37 + fVar36 * fVar35);
                    x[iVar6] = sVar30;
                    lVar17 = lVar17 + 1;
                  } while (iVar13 != lVar17);
                }
                lVar15 = lVar15 + 1;
                fVar38 = fVar38 + (float)((iVar13 - iVar23) * 8);
                iVar23 = iVar13;
              } while (lVar15 != iVar4);
            }
          }
          bVar8 = 0 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar8);
        goto LAB_001120da;
      }
    }
  }
  else if (cVar3 == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    if (-1 < (long)*(int *)((long)local_170 + 4)) {
      fVar38 = 0.0;
      lVar19 = (long)*(int *)((long)local_170 + 4);
      do {
        lVar9 = *(long *)((long)local_170 + 0x30);
        iVar23 = *(int *)(lVar9 + lVar19 * 4);
        lVar15 = (long)iVar23;
        iVar4 = *(int *)(*(long *)((long)local_170 + 0x20) + lVar15 * 4);
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar15 * 4) - iVar4;
        nsupc = *(int *)(lVar9 + 4 + lVar19 * 4) - iVar23;
        lVar10 = *(long *)((long)local_170 + 0x10);
        iVar13 = *(int *)(lVar10 + lVar15 * 4);
        local_178 = (void *)CONCAT44(local_178._4_4_,iVar13);
        iVar6 = *(int *)(lVar9 + 4 + lVar19 * 4);
        if (iVar23 < iVar6) {
          lVar9 = lVar15;
          iVar23 = iVar13;
          do {
            iVar12 = iVar23 + nsupc;
            iVar23 = *(int *)(lVar10 + 4 + lVar9 * 4);
            if (iVar12 < iVar23) {
              sVar28 = x[lVar9];
              lVar14 = (long)iVar12;
              piVar20 = (int *)(*(long *)((long)local_170 + 0x18) + (long)(iVar4 + nsupc) * 4);
              do {
                temp.r = *(float *)(lVar7 + lVar14 * 8);
                fVar34 = *(float *)(lVar7 + 4 + lVar14 * 8);
                temp.i = -fVar34;
                fVar36 = x[*piVar20].r;
                fVar37 = x[*piVar20].i;
                fVar35 = sVar28.i;
                sVar28.r = sVar28.r - (temp.r * fVar36 + fVar37 * fVar34);
                sVar28.i = fVar35 - (temp.r * fVar37 + fVar36 * temp.i);
                x[lVar9] = sVar28;
                lVar14 = lVar14 + 1;
                piVar20 = piVar20 + 1;
              } while (lVar14 < iVar23);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != iVar6);
        }
        fVar38 = fVar38 + (float)((nsupr - nsupc) * nsupc * 8);
        if (1 < nsupc) {
          fVar38 = fVar38 + (float)((nsupc + -1) * nsupc * 4);
          ctrsv_("L",(char *)local_160,"U",&nsupc,(singlecomplex *)(lVar7 + (long)iVar13 * 8),&nsupr
                 ,x + lVar15,&incx);
        }
        bVar8 = 0 < lVar19;
        lVar19 = lVar19 + -1;
      } while (bVar8);
      goto LAB_001120da;
    }
  }
  else {
    if (U->nrow == 0) {
      return 0;
    }
    if (-1 < *(int *)((long)local_170 + 4)) {
      fVar38 = 0.0;
      lVar9 = 0;
      do {
        lVar10 = *(long *)((long)local_170 + 0x30);
        iVar23 = *(int *)(lVar10 + lVar9 * 4);
        lVar15 = (long)iVar23;
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar15 * 4) -
                *(int *)(*(long *)((long)local_170 + 0x20) + lVar15 * 4);
        iVar13 = *(int *)(lVar10 + 4 + lVar9 * 4) - iVar23;
        local_158 = (long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar15 * 4);
        iVar4 = *(int *)(lVar10 + 4 + lVar9 * 4);
        if (iVar23 < iVar4) {
          lVar10 = *(long *)((long)local_178 + 0x18);
          lVar14 = lVar15;
          iVar23 = *(int *)(lVar10 + lVar15 * 4);
          do {
            iVar6 = *(int *)(lVar10 + 4 + lVar14 * 4);
            if (iVar6 - iVar23 != 0 && iVar23 <= iVar6) {
              lVar17 = *(long *)((long)local_178 + 0x10);
              sVar32 = x[lVar14];
              lVar22 = (long)iVar23;
              do {
                temp.r = *(float *)(lVar19 + lVar22 * 8);
                fVar34 = *(float *)(lVar19 + 4 + lVar22 * 8);
                temp.i = -fVar34;
                fVar36 = x[*(int *)(lVar17 + lVar22 * 4)].r;
                fVar37 = x[*(int *)(lVar17 + lVar22 * 4)].i;
                fVar35 = sVar32.i;
                sVar32.r = sVar32.r - (temp.r * fVar36 + fVar37 * fVar34);
                sVar32.i = fVar35 - (temp.r * fVar37 + fVar36 * temp.i);
                x[lVar14] = sVar32;
                lVar22 = lVar22 + 1;
              } while (iVar6 != lVar22);
            }
            lVar14 = lVar14 + 1;
            fVar38 = fVar38 + (float)((iVar6 - iVar23) * 8);
            iVar23 = iVar6;
          } while (lVar14 != iVar4);
        }
        psVar2 = (singlecomplex *)(lVar7 + local_158 * 8);
        nsupc = iVar13;
        if (iVar13 == 1) {
          temp.r = psVar2->r;
          temp.i = -psVar2->i;
          c_div(x + lVar15,x + lVar15,&temp);
        }
        else {
          ctrsv_("U",(char *)local_160,"N",&nsupc,psVar2,&nsupr,x + lVar15,&incx);
        }
        fVar38 = fVar38 + (float)((iVar13 * 4 + 0xe) * iVar13);
        bVar8 = lVar9 < *(int *)((long)local_170 + 4);
        lVar9 = lVar9 + 1;
      } while (bVar8);
      goto LAB_001120da;
    }
  }
  fVar38 = 0.0;
LAB_001120da:
  stat->ops[0x11] = fVar38 + stat->ops[0x11];
  superlu_free(local_148);
  return 0;
}

Assistant:

int
sp_ctrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, singlecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    singlecomplex temp;
    singlecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    singlecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ctrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = singlecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ctrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 c_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ctrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    cgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    clsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    cmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			c_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 c_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[fsupc], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ctrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    cusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			cc_mult(&comp_zero, &x[jcol], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			cc_mult(&comp_zero, &x[irow], &Lval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ctrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[irow], &Uval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ctrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        cc_conj(&temp, &Lval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ctrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        cc_conj(&temp, &Uval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    cc_conj(&temp, &Lval[luptr]);
		    c_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ctrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}